

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

double __thiscall libDAI::Properties::FromStringTo<double>(Properties *this,PropertyKey *key)

{
  bool bVar1;
  any *in_RDI;
  double result;
  stringstream ss;
  PropertyValue val;
  PropertyKey *in_stack_fffffffffffffdf8;
  type_info *in_stack_fffffffffffffe00;
  any *in_stack_fffffffffffffe08;
  ostream *poVar2;
  type_info *local_1e0;
  string local_1d8 [40];
  PropertyKey *in_stack_fffffffffffffe50;
  Properties *in_stack_fffffffffffffe58;
  ostream local_198 [400];
  type_info *local_8;
  
  Get((Properties *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  boost::any::any(in_RDI,in_stack_fffffffffffffe08);
  boost::any::type((any *)in_stack_fffffffffffffe00);
  bVar1 = std::type_info::operator!=
                    (in_stack_fffffffffffffe00,(type_info *)in_stack_fffffffffffffdf8);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe58);
    poVar2 = local_198;
    GetAs<std::__cxx11::string>(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::operator<<(poVar2,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::istream::operator>>(&stack0xfffffffffffffe58,(double *)&local_1e0);
    local_8 = local_1e0;
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe58);
  }
  else {
    in_stack_fffffffffffffe00 =
         (type_info *)GetAs<double>(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    local_8 = in_stack_fffffffffffffe00;
  }
  boost::any::~any((any *)in_stack_fffffffffffffe00);
  return (double)local_8;
}

Assistant:

ValueType FromStringTo(const PropertyKey &key) const { 
                PropertyValue val = Get(key);
                if( val.type() != typeid(ValueType) ) {
                    assert( val.type() == typeid(std::string) );

                    std::stringstream ss;
                    ss << GetAs<std::string>(key);
                    ValueType result;
                    ss >> result;

                    return result;
                } else
                    return GetAs<ValueType>(key);
            }